

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

void __thiscall cdns_block_statistics::clear(cdns_block_statistics *this)

{
  if (this->is_filled == true) {
    this->unmatched_queries = 0;
    this->unmatched_responses = 0;
    this->discarded_opcode = 0;
    this->malformed_items = 0;
    this->current_block = (cdnsBlock *)0x0;
    this->processed_messages = 0;
    this->qr_data_items = 0;
    this->is_filled = false;
  }
  return;
}

Assistant:

void cdns_block_statistics::clear()
{
    if (is_filled) {
        current_block = NULL;
        processed_messages = 0;
        qr_data_items = 0;
        unmatched_queries = 0;
        unmatched_responses = 0;
        discarded_opcode = 0;
        malformed_items = 0;
        is_filled = 0;
    }
}